

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

transformation_t * __thiscall
opengv::absolute_pose::epnp
          (transformation_t *__return_storage_ptr__,absolute_pose *this,AbsoluteAdapterBase *adapter
          ,Indices *indices)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  Indices *pIVar13;
  SrcEvaluatorType srcEvaluator;
  long lVar14;
  int iVar15;
  double dVar16;
  double (*R) [3];
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  rotation_t rotation;
  double t_epnp [3];
  double R_epnp [3] [3];
  Epnp PnP;
  double adStack_238 [6];
  undefined8 uStack_208;
  double local_200;
  double local_1f8;
  double dStack_1f0;
  ulong local_1e8;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_198;
  double dStack_190;
  double dStack_188;
  Epnp local_148;
  
  adStack_238[1] = 6.28661479409548e-318;
  modules::Epnp::Epnp(&local_148);
  adStack_238[1] = 6.28667408197298e-318;
  modules::Epnp::set_maximum_number_of_correspondences
            (&local_148,
             *(int *)((adapter->_t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 1));
  adStack_238[1] = 6.28673831050694e-318;
  modules::Epnp::reset_correspondences(&local_148);
  if ((adapter->_t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] != 0.0) {
    lVar14 = 0;
    dVar16 = 0.0;
    do {
      iVar15 = SUB84(dVar16,0);
      pIVar13 = (Indices *)(lVar14 >> 0x1e);
      iVar12 = iVar15;
      if (*(char *)&adapter->_vptr_AbsoluteAdapterBase != '\0') {
        indices = pIVar13;
        iVar12 = *(int *)(&pIVar13->_useIndices +
                         *(long *)(adapter->_t).
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[0]);
      }
      adStack_238[1] = 6.28709897842841e-318;
      (**(code **)(*(long *)this + 0x30))(&local_198,this,(long)iVar12);
      if (*(char *)&adapter->_vptr_AbsoluteAdapterBase != '\0') {
        iVar15 = *(int *)(&pIVar13->_useIndices +
                         *(long *)(adapter->_t).
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[0]);
        indices = pIVar13;
      }
      adStack_238[1] = 6.28731142665612e-318;
      (**(code **)(*(long *)this + 0x10))(adStack_238 + 2,this,(long)iVar15);
      adStack_238[1] = 6.28756834079195e-318;
      modules::Epnp::add_correspondence
                (&local_148,local_198,dStack_190,dStack_188,adStack_238[2],adStack_238[3],
                 adStack_238[4]);
      dVar16 = (double)((long)dVar16 + 1);
      lVar14 = lVar14 + 0x100000000;
    } while ((ulong)dVar16 <
             (ulong)(adapter->_t).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[1]);
  }
  R = (double (*) [3])&local_198;
  adStack_238[1] = 6.28784007689717e-318;
  modules::Epnp::compute_pose(&local_148,R,&local_1b8);
  dVar11 = dStack_1f0;
  dVar10 = local_1f8;
  dVar9 = local_200;
  dVar8 = adStack_238[5];
  dVar7 = adStack_238[4];
  dVar16 = adStack_238[3];
  auVar20 = vpbroadcastq_avx512vl();
  auVar20 = vpaddq_avx2(auVar20,_DAT_001e3c20);
  lVar14 = 0;
  uVar17 = CONCAT71((int7)((ulong)indices >> 8),7) & 0xffffffff;
  do {
    auVar21._8_8_ = (ulong)((byte)(uVar17 >> 1) & 1) * (long)(*R)[1];
    auVar21._0_8_ = (ulong)((byte)uVar17 & 1) * (long)(*R)[0];
    auVar21._16_8_ = (ulong)((byte)(uVar17 >> 2) & 1) * (long)(*R)[2];
    auVar21._24_8_ = 0;
    auVar22 = vpbroadcastq_avx512vl();
    lVar14 = lVar14 + 1;
    R = R + 1;
    auVar22 = vpsllq_avx2(auVar22,3);
    auVar22 = vpaddq_avx2(auVar20,auVar22);
    vscatterqpd_avx512vl(ZEXT832(0) + auVar22,uVar17,auVar21);
  } while (lVar14 != 3);
  lVar14 = 0x10;
  local_1d8 = local_1b8;
  dStack_1d0 = dStack_1b0;
  local_1c8 = local_1a8;
  adStack_238[5] = adStack_238[3];
  adStack_238[3] = dVar8;
  local_1f8 = adStack_238[4];
  adStack_238[4] = dVar10;
  dStack_1f0 = local_200;
  local_200 = dVar11;
  auVar23._0_8_ = local_1b8 * adStack_238[2];
  auVar23._8_8_ = local_1b8 * dVar8;
  auVar5._8_8_ = uStack_208;
  auVar5._0_8_ = dVar16;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_1e8;
  auVar19._8_8_ = 0x8000000000000000;
  auVar19._0_8_ = 0x8000000000000000;
  auVar18 = vxorpd_avx512vl(auVar18,auVar19);
  auVar3._8_8_ = dStack_1b0;
  auVar3._0_8_ = dStack_1b0;
  auVar19 = vfnmsub132pd_avx512vl(auVar5,auVar23,auVar3);
  auVar24._8_8_ = local_1a8;
  auVar24._0_8_ = local_1a8;
  auVar6._8_8_ = dVar9;
  auVar6._0_8_ = dVar7;
  auVar19 = vfnmadd231pd_fma(auVar19,auVar24,auVar6);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
    .m_data.array + 9) = auVar19;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
  m_data.array[0xb] = (local_1a8 * auVar18._0_8_ - dVar11 * dStack_1b0) - dVar10 * local_1b8;
  do {
    uVar4 = *(undefined8 *)((long)adStack_238 + lVar14 + 8);
    uVar2 = *(undefined8 *)((long)adStack_238 + lVar14 + 0x10);
    puVar1 = (undefined8 *)
             ((long)(__return_storage_ptr__->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.
                    array + lVar14 + -0x10);
    *puVar1 = *(undefined8 *)((long)adStack_238 + lVar14);
    puVar1[1] = uVar4;
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
            m_storage.m_data.array + lVar14) = uVar2;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x58);
  adStack_238[1] = 6.28938650236865e-318;
  modules::Epnp::~Epnp(&local_148);
  return __return_storage_ptr__;
}

Assistant:

transformation_t epnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  //starting from 4 points, we have a unique solution
  assert(indices.size() > 5);

  modules::Epnp PnP;
  PnP.set_maximum_number_of_correspondences(indices.size());
  PnP.reset_correspondences();

  for( size_t i = 0; i < indices.size(); i++ )
  {
    point_t p = adapter.getPoint(indices[i]);
    bearingVector_t f = adapter.getBearingVector(indices[i]);
    PnP.add_correspondence(p[0], p[1], p[2], f[0], f[1], f[2]);
  }

  double R_epnp[3][3], t_epnp[3];
  PnP.compute_pose(R_epnp, t_epnp);

  rotation_t rotation;
  translation_t translation;

  for(int r = 0; r < 3; r++)
  {
    for(int c = 0; c < 3; c++)
      rotation(r,c) = R_epnp[r][c];
  }

  translation[0] = t_epnp[0];
  translation[1] = t_epnp[1];
  translation[2] = t_epnp[2];

  //take inverse transformation
  rotation.transposeInPlace();
  translation = -rotation * translation;

  transformation_t transformation;
  transformation.col(3) = translation;
  transformation.block<3,3>(0,0) = rotation;
  return transformation;
}